

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall
caffe::HDF5DataParameter::HDF5DataParameter(HDF5DataParameter *this,HDF5DataParameter *from)

{
  void *pvVar1;
  string *initial_value;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__HDF5DataParameter_006f99b0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  (this->source_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  if ((((from->_has_bits_).has_bits_[0] & 1) != 0) &&
     (initial_value = (from->source_).ptr_,
     initial_value != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_))
  {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->source_,initial_value);
  }
  this->shuffle_ = from->shuffle_;
  this->batch_size_ = from->batch_size_;
  return;
}

Assistant:

HDF5DataParameter::HDF5DataParameter(const HDF5DataParameter& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  source_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_source()) {
    source_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.source_);
  }
  ::memcpy(&batch_size_, &from.batch_size_,
    reinterpret_cast<char*>(&shuffle_) -
    reinterpret_cast<char*>(&batch_size_) + sizeof(shuffle_));
  // @@protoc_insertion_point(copy_constructor:caffe.HDF5DataParameter)
}